

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrref.h
# Opt level: O0

void __thiscall StringRef::append_utf8(StringRef *this,wchar_t ch)

{
  int in_ESI;
  long unaff_retaddr;
  undefined4 in_stack_00000008;
  char buf [3];
  
  if (in_ESI < 0x80) {
    append(this,(char *)CONCAT44(ch,in_stack_00000008),unaff_retaddr);
  }
  else if (in_ESI < 0x800) {
    append(this,(char *)CONCAT44(ch,in_stack_00000008),unaff_retaddr);
  }
  else {
    append(this,(char *)CONCAT44(ch,in_stack_00000008),unaff_retaddr);
  }
  return;
}

Assistant:

void append_utf8(wchar_t ch)
    {
        char buf[3];

        if (ch <= 0x7f)
        {
            /* it's in the range 0..7f - encode as one byte */
            buf[0] = (char)ch;
            append(buf, 1);
        }
        else if (ch <= 0x7ff)
        {
            /* it's in the range 80..7ff - encode as two bytes */
            buf[0] = (char)(0xC0 | ((ch >> 6) & 0x1F));
            buf[1] = (char)(0x80 | (ch & 0x3F));
            append(buf, 2);
        }
        else
        {
            /* it's in the range 800..ffff - encode as three bytes */
            buf[0] = (char)(0xE0 | ((ch >> 12) & 0x0F));
            buf[1] = (char)(0x80 | ((ch >> 6) & 0x3F));
            buf[2] = (char)(0x80 | (ch & 0x3F));
            append(buf, 3);
        }
    }